

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

TextureFormat sglr::toTextureFormat(PixelFormat *pixelFmt)

{
  TestError *this;
  long lVar1;
  
  if (toTextureFormat(tcu::PixelFormat_const&)::pixelFormatMap == '\0') {
    toTextureFormat();
  }
  lVar1 = 0;
  while ((((*(int *)((long)&toTextureFormat::pixelFormatMap[0].pixelFmt.redBits + lVar1) !=
            pixelFmt->redBits ||
           (*(int *)((long)&toTextureFormat::pixelFormatMap[0].pixelFmt.greenBits + lVar1) !=
            pixelFmt->greenBits)) ||
          (*(int *)((long)&toTextureFormat::pixelFormatMap[0].pixelFmt.blueBits + lVar1) !=
           pixelFmt->blueBits)) ||
         (*(int *)((long)&toTextureFormat::pixelFormatMap[0].pixelFmt.alphaBits + lVar1) !=
          pixelFmt->alphaBits))) {
    lVar1 = lVar1 + 0x18;
    if (lVar1 == 0x78) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Can\'t map pixel format to texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0xb3);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return *(TextureFormat *)((long)&toTextureFormat::pixelFormatMap[0].texFmt.order + lVar1);
}

Assistant:

tcu::TextureFormat toTextureFormat (const tcu::PixelFormat& pixelFmt)
{
	static const struct
	{
		tcu::PixelFormat	pixelFmt;
		tcu::TextureFormat	texFmt;
	} pixelFormatMap[] =
	{
		{ tcu::PixelFormat(8,8,8,8),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(8,8,8,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(4,4,4,4),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_4444)	},
		{ tcu::PixelFormat(5,5,5,1),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_5551)	},
		{ tcu::PixelFormat(5,6,5,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_SHORT_565)	}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pixelFormatMap); ndx++)
	{
		if (pixelFormatMap[ndx].pixelFmt == pixelFmt)
			return pixelFormatMap[ndx].texFmt;
	}

	TCU_FAIL("Can't map pixel format to texture format");
}